

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bcon-extract.c
# Opt level: O0

void test_inline_doc(void)

{
  byte bVar1;
  int32_t iVar2;
  int32_t iVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  int32_t *piVar6;
  undefined8 uVar7;
  int32_t *piVar8;
  undefined8 in_stack_ffffffffffffff68;
  undefined4 uVar9;
  undefined8 in_stack_ffffffffffffff88;
  undefined4 uVar10;
  bson_t *bcon;
  int32_t b;
  int32_t a;
  
  uVar10 = (undefined4)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  uVar9 = (undefined4)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  uVar4 = bson_bcon_magic();
  iVar2 = bcon_ensure_int32(2);
  uVar5 = bson_bcon_magic();
  iVar3 = bcon_ensure_int32(1);
  uVar4 = bcon_new(0,"foo","{","b",uVar4,0xf,CONCAT44(uVar9,iVar2),"a",uVar5,0xf,
                   CONCAT44(uVar10,iVar3),"}",0);
  uVar5 = bson_bcone_magic();
  piVar6 = bcon_ensure_int32_ptr((int32_t *)((long)&bcon + 4));
  uVar7 = bson_bcone_magic();
  piVar8 = bcon_ensure_int32_ptr((int32_t *)&bcon);
  bVar1 = bcon_extract(uVar4,"foo","{","a",uVar5,0xf,piVar6,"b",uVar7,0xf,piVar8,"}",0);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-extract.c"
            ,0x165,"test_inline_doc",
            "BCON_EXTRACT ( bcon, \"foo\", \"{\", \"a\", BCONE_INT32 (a), \"b\", BCONE_INT32 (b), \"}\")"
           );
    abort();
  }
  if (bcon._4_4_ != 1) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-extract.c"
            ,0x167,"test_inline_doc","a == 1");
    abort();
  }
  if ((int)bcon != 2) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-extract.c"
            ,0x168,"test_inline_doc","b == 2");
    abort();
  }
  bson_destroy(uVar4);
  return;
}

Assistant:

static void
test_inline_doc (void)
{
   int32_t a, b;

   bson_t *bcon =
      BCON_NEW ("foo", "{", "b", BCON_INT32 (2), "a", BCON_INT32 (1), "}");

   BSON_ASSERT (BCON_EXTRACT (
      bcon, "foo", "{", "a", BCONE_INT32 (a), "b", BCONE_INT32 (b), "}"));

   BSON_ASSERT (a == 1);
   BSON_ASSERT (b == 2);

   bson_destroy (bcon);
}